

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

bool leveldb::FindLargestKey
               (InternalKeyComparator *icmp,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files,
               InternalKey *largest_key)

{
  pointer ppFVar1;
  pointer ppFVar2;
  pointer ppFVar3;
  int iVar4;
  size_t i;
  ulong uVar5;
  
  ppFVar1 = (files->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (files->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar1 != ppFVar2) {
    std::__cxx11::string::_M_assign((string *)largest_key);
    for (uVar5 = 1;
        ppFVar3 = (files->
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  )._M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(files->
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3);
        uVar5 = uVar5 + 1) {
      iVar4 = InternalKeyComparator::Compare(icmp,&ppFVar3[uVar5]->largest,largest_key);
      if (0 < iVar4) {
        std::__cxx11::string::_M_assign((string *)largest_key);
      }
    }
  }
  return ppFVar1 != ppFVar2;
}

Assistant:

void VersionSet::MarkFileNumberUsed(uint64_t number) {
  if (next_file_number_ <= number) {
    next_file_number_ = number + 1;
  }
}